

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_RET(Context *ctx)

{
  Buffer *pBVar1;
  
  if (ctx->profile_supports_nv2 != 0) {
    output_line(ctx,"RET;");
  }
  pBVar1 = ctx->mainline;
  if (pBVar1 == (Buffer *)0x0) {
    pBVar1 = buffer_create(0x100,MallocBridge,FreeBridge,ctx);
    ctx->mainline = pBVar1;
    if (pBVar1 == (Buffer *)0x0) {
      return;
    }
  }
  ctx->output = pBVar1;
  return;
}

Assistant:

EMIT_ARB1_OPCODE_UNIMPLEMENTED_FUNC(LOOP)

static void emit_ARB1_RET(Context *ctx)
{
    // don't fail() if no nv2...maybe we're just ending the mainline?
    //  if we're ending a LABEL that had no CALL, this would all be written
    //  to ctx->ignore anyhow, so this should be "safe" ... arb1 profile will
    //  just end up throwing all this code out.
    if (support_nv2(ctx))  // no branching in stock ARB1.
        output_line(ctx, "RET;");
    set_output(ctx, &ctx->mainline); // in case we were ignoring this function.
}